

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

uint Lib::List<unsigned_int>::pop(List<unsigned_int> **lst)

{
  uint uVar1;
  List<unsigned_int> *ptr;
  List<unsigned_int> *pLVar2;
  
  ptr = *lst;
  pLVar2 = ptr->_tail;
  uVar1 = ptr->_head;
  operator_delete(ptr,0x10);
  *lst = pLVar2;
  return uVar1;
}

Assistant:

static C pop(List* &lst)
  {
    ASS_NEQ(lst,0);

    List* tail = lst->tail();
    C result = lst->head();
    delete lst;
    lst = tail;

    return result;
  }